

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

CK_VOID_PTR __thiscall HandleManager::getSession(HandleManager *this,CK_SESSION_HANDLE hSession)

{
  bool bVar1;
  pointer ppVar2;
  MutexLocker *in_RDI;
  bool bVar3;
  iterator it;
  MutexLocker lock;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  _Self local_48 [3];
  _Self local_30 [5];
  CK_VOID_PTR local_8;
  
  MutexLocker::MutexLocker
            (in_RDI,(Mutex *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
       ::find((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
               *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),(key_type *)0x1cc169)
  ;
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
       ::end((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
              *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar1 = std::operator==(local_30,local_48);
  bVar3 = true;
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1cc1b3);
    bVar3 = (ppVar2->second).kind != 1;
  }
  if (bVar3) {
    local_8 = (CK_VOID_PTR)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1cc207);
    local_8 = (ppVar2->second).object;
  }
  MutexLocker::~MutexLocker(in_RDI);
  return local_8;
}

Assistant:

CK_VOID_PTR HandleManager::getSession(const CK_SESSION_HANDLE hSession)
{
	MutexLocker lock(handlesMutex);

	std::map< CK_ULONG, Handle>::iterator it = handles.find(hSession);
	if (it == handles.end() || CKH_SESSION != it->second.kind)
		return NULL_PTR;
	return it->second.object;
}